

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenVerifyCall
          (CSharpGenerator *this,CodeWriter *code_,FieldDef *field,char *prefix)

{
  Value *type;
  BaseType BVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  string union_name;
  string local_1f0;
  key_type local_1d0;
  _Alloc_hider local_1b0;
  StructDef *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Type local_50;
  
  paVar7 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"PRE","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,prefix,(allocator<char> *)&local_1b0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  paVar6 = &local_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"NAME","");
  ConvertCase(&local_1f0,(string *)field,kUpperCamel,kSnake);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"REQUIRED","");
  bVar8 = field->presence == kRequired;
  pcVar4 = "";
  if (bVar8) {
    pcVar4 = "Required";
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,pcVar4,pcVar4 + (ulong)bVar8 * 8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"REQUIRED_FLAG","");
  bVar8 = field->presence == kRequired;
  pcVar4 = "false";
  if (bVar8) {
    pcVar4 = "true";
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,pcVar4,pcVar4 + ((ulong)bVar8 ^ 5));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"TYPE","");
  type = &field->value;
  GenTypeGet_abi_cxx11_(&local_1f0,this,&type->type);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"INLINESIZE","");
  sVar3 = InlineSize(&type->type);
  NumToString<unsigned_long>(&local_1f0,sVar3);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"OFFSET","");
  NumToString<unsigned_short>(&local_1f0,(field->value).offset);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&code_->value_map_,&local_1d0);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar6) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  BVar1 = (type->type).base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
LAB_001c3044:
    local_1d0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ALIGN","");
    sVar3 = InlineAlignment(&type->type);
    NumToString<unsigned_long>(&local_1f0,sVar3);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&code_->value_map_,&local_1d0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar6) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "{{PRE}}      && verifier.VerifyField(tablePos, {{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, {{REQUIRED_FLAG}})"
               ,"");
    CodeWriter::operator+=(code_,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_001c3133:
    BVar1 = (type->type).base_type;
  }
  else if (BVar1 == BASE_TYPE_STRUCT) {
    if (((field->value).type.struct_def)->fixed == true) goto LAB_001c3044;
    goto LAB_001c3133;
  }
  paVar6 = &local_1d0.field_2;
  paVar7 = &local_1f0.field_2;
  switch(BVar1) {
  case BASE_TYPE_STRING:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "{{PRE}}      && verifier.VerifyString(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
               ,"");
    CodeWriter::operator+=(code_,&local_b0);
    local_90.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var5._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    break;
  case BASE_TYPE_VECTOR:
    BVar1 = (field->value).type.element;
    if (BVar1 == BASE_TYPE_UNION) {
      return;
    }
    if (BVar1 == BASE_TYPE_STRUCT) {
      if (((field->value).type.struct_def)->fixed == false) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
                   ,"");
        CodeWriter::operator+=(code_,&local_f0);
        local_90.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        _Var5._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return;
        }
      }
      else {
        local_1d0._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,"VECTOR_ELEM_INLINESIZE","");
        aStack_1a0._8_2_ = (field->value).type.fixed_length;
        local_1b0._M_p._4_4_ = 0;
        local_1b0._M_p._0_4_ = (field->value).type.element;
        local_1a8 = (field->value).type.struct_def;
        aStack_1a0._M_allocated_capacity = (size_type)(field->value).type.enum_def;
        sVar3 = InlineSize((Type *)&local_1b0);
        NumToString<unsigned_long>(&local_1f0,sVar3);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&code_->value_map_,&local_1d0);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar7) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar6) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                   ,"");
        CodeWriter::operator+=(code_,&local_110);
        local_90.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
        _Var5._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == &local_110.field_2) {
          return;
        }
      }
    }
    else {
      if (BVar1 != BASE_TYPE_STRING) {
        GetNestedFlatBufferName_abi_cxx11_(&local_1d0,this,field);
        if (local_1d0._M_string_length == 0) {
          if (field->flexbuffer == true) {
            paVar7 = &local_150.field_2;
            local_150._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,
                       "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})"
                       ,"");
            CodeWriter::operator+=(code_,&local_150);
            _Var5._M_p = local_150._M_dataplus._M_p;
          }
          else {
            local_1f0._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f0,"VECTOR_ELEM_INLINESIZE","");
            local_50.base_type = (field->value).type.element;
            local_50.fixed_length = (field->value).type.fixed_length;
            local_50.element = BASE_TYPE_NONE;
            local_50.struct_def = (field->value).type.struct_def;
            local_50.enum_def = (field->value).type.enum_def;
            sVar3 = InlineSize(&local_50);
            NumToString<unsigned_long>((string *)&local_1b0,sVar3);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&code_->value_map_,&local_1f0);
            std::__cxx11::string::_M_assign((string *)pmVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_p != &aStack_1a0) {
              operator_delete(local_1b0._M_p,(ulong)(aStack_1a0._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar7) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            paVar7 = &local_170.field_2;
            local_170._M_dataplus._M_p = (pointer)paVar7;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,
                       "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                       ,"");
            CodeWriter::operator+=(code_,&local_170);
            _Var5._M_p = local_170._M_dataplus._M_p;
          }
        }
        else {
          local_1f0._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"CPP_NAME","");
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&code_->value_map_,&local_1f0);
          std::__cxx11::string::_M_assign((string *)pmVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar7) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          paVar7 = &local_130.field_2;
          local_130._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,
                     "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
                     ,"");
          CodeWriter::operator+=(code_,&local_130);
          _Var5._M_p = local_130._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != paVar7) {
          local_190.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          goto LAB_001c37bb;
        }
        goto LAB_001c37c3;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
                 ,"");
      CodeWriter::operator+=(code_,&local_d0);
      local_90.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      _Var5._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
        return;
      }
    }
    break;
  case BASE_TYPE_STRUCT:
    if (((field->value).type.struct_def)->fixed != false) {
      return;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "{{PRE}}      && verifier.VerifyTable(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
               ,"");
    CodeWriter::operator+=(code_,&local_90);
    _Var5._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return;
    }
    break;
  case BASE_TYPE_UNION:
    NamespacedName_abi_cxx11_(&local_1d0,this,&((field->value).type.enum_def)->super_Definition);
    local_1f0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ENUM_NAME1","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&code_->value_map_,&local_1f0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ENUM_NAME","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&code_->value_map_,&local_1f0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"SUFFIX","");
    local_1b0._M_p = (pointer)&aStack_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"_type","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&code_->value_map_,&local_1f0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_p != &aStack_1a0) {
      operator_delete(local_1b0._M_p,(ulong)(aStack_1a0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"TYPE_ID_OFFSET","");
    NumToString<unsigned_long>((string *)&local_1b0,(ulong)(field->value).offset - 2);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&code_->value_map_,&local_1f0);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_p != &aStack_1a0) {
      operator_delete(local_1b0._M_p,(ulong)(aStack_1a0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,
               "{{PRE}}      && verifier.VerifyUnion(tablePos, {{TYPE_ID_OFFSET}}, {{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
               ,"");
    CodeWriter::operator+=(code_,&local_190);
    _Var5._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
LAB_001c37bb:
      operator_delete(_Var5._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
LAB_001c37c3:
    local_90.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    _Var5._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == paVar6) {
      return;
    }
    break;
  default:
    goto switchD_001c3151_default;
  }
  operator_delete(_Var5._M_p,local_90.field_2._M_allocated_capacity + 1);
switchD_001c3151_default:
  return;
}

Assistant:

void GenVerifyCall(CodeWriter &code_, const FieldDef &field,
                     const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("NAME", ConvertCase(field.name, Case::kUpperCamel));
    code_.SetValue("REQUIRED", field.IsRequired() ? "Required" : "");
    code_.SetValue("REQUIRED_FLAG", field.IsRequired() ? "true" : "false");
    code_.SetValue("TYPE", GenTypeGet(field.value.type));
    code_.SetValue("INLINESIZE", NumToString(InlineSize(field.value.type)));
    code_.SetValue("OFFSET", NumToString(field.value.offset));

    if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type)) {
      code_.SetValue("ALIGN", NumToString(InlineAlignment(field.value.type)));
      code_ +=
          "{{PRE}}      && verifier.VerifyField(tablePos, "
          "{{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, "
          "{{REQUIRED_FLAG}})";
    } else {
      // TODO - probably code below should go to this 'else' - code_ +=
      // "{{PRE}}VerifyOffset{{REQUIRED}}(verifier, {{OFFSET}})\\";
    }

    switch (field.value.type.base_type) {
      case BASE_TYPE_UNION: {
        auto union_name = NamespacedName(*field.value.type.enum_def);
        code_.SetValue("ENUM_NAME1", field.value.type.enum_def->name);
        code_.SetValue("ENUM_NAME", union_name);
        code_.SetValue("SUFFIX", UnionTypeFieldSuffix());
        // Caution: This construction assumes, that UNION type id element has
        // been created just before union data and its offset precedes union.
        // Such assumption is common in flatbuffer implementation
        code_.SetValue("TYPE_ID_OFFSET",
                       NumToString(field.value.offset - sizeof(voffset_t)));
        code_ +=
            "{{PRE}}      && verifier.VerifyUnion(tablePos, "
            "{{TYPE_ID_OFFSET}}, "
            "{{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, "
            "{{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (!field.value.type.struct_def->fixed) {
          code_ +=
              "{{PRE}}      && verifier.VerifyTable(tablePos, "
              "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
              "{{REQUIRED_FLAG}})";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ +=
            "{{PRE}}      && verifier.VerifyString(tablePos, "
            "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_VECTOR: {
        switch (field.value.type.element) {
          case BASE_TYPE_STRING: {
            code_ +=
                "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, "
                "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (!field.value.type.struct_def->fixed) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && "
                  "verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
          }
          case BASE_TYPE_UNION: {
            // Vectors of unions are not yet supported for go
            break;
          }
          default:
            // Generate verifier for vector of data.
            // It may be either nested flatbuffer of just vector of bytes
            auto nfn = GetNestedFlatBufferName(field);
            if (!nfn.empty()) {
              code_.SetValue("CPP_NAME", nfn);
              // FIXME: file_identifier.
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else if (field.flexbuffer) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
        }

        break;
      }
      default: {
        break;
      }
    }
  }